

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

uint16_t eia608_from_utf8_1(utf8_char_t *c,int chan)

{
  uint16_t cc_data_00;
  int in_ESI;
  utf8_char_t *in_RDI;
  uint16_t cc_data;
  uint16_t local_2;
  
  cc_data_00 = _eia608_from_utf8(in_RDI);
  if (cc_data_00 == 0) {
    local_2 = 0;
  }
  else {
    if (in_ESI != 0) {
      eia608_is_basicna(cc_data_00);
    }
    local_2 = eia608_parity(0);
  }
  return local_2;
}

Assistant:

uint16_t eia608_from_utf8_1(const utf8_char_t* c, int chan)
{
    uint16_t cc_data = _eia608_from_utf8(c);

    if (0 == cc_data) {
        return cc_data;
    }

    if (chan && !eia608_is_basicna(cc_data)) {
        cc_data |= 0x0800;
    }

    return eia608_parity(cc_data);
}